

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::InternalException::InternalException<short,unsigned_long,unsigned_long>
          (InternalException *this,string *msg,short params,unsigned_long params_1,
          unsigned_long params_2)

{
  undefined6 in_register_00000012;
  unsigned_long in_R9;
  string local_30;
  
  Exception::ConstructMessage<short,unsigned_long,unsigned_long>
            (&local_30,(Exception *)msg,(string *)CONCAT62(in_register_00000012,params),
             (short)params_1,params_2,in_R9);
  duckdb::InternalException::InternalException(this,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit InternalException(const string &msg, ARGS... params)
	    : InternalException(ConstructMessage(msg, params...)) {
	}